

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O3

int __thiscall
opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor::operator()
          (PollishCoefficientsFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double __x;
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  void *pvVar4;
  undefined8 *puVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  Matrix<double,_20,_1,_0,_20,_1> monomials;
  const_blas_data_mapper<double,_long,_1> local_1a0;
  const_blas_data_mapper<double,_long,_0> local_190;
  ResScalar local_180;
  double dStack_178;
  double dStack_170;
  double dStack_168;
  double dStack_160;
  double dStack_158;
  double dStack_150;
  double dStack_148;
  double dStack_140;
  double dStack_138;
  double local_120;
  double local_118;
  double local_110;
  double dStack_108;
  double local_100;
  undefined8 local_f8;
  double local_f0;
  undefined8 local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  undefined8 local_88;
  
  local_120 = pow(*(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data,3.0);
  local_118 = pow((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data[1],3.0);
  pauVar2 = (undefined1 (*) [16])
            (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  auVar1 = *pauVar2;
  local_a8 = *(double *)(*pauVar2 + 8);
  local_c8 = auVar1._0_8_;
  auVar7._0_8_ = local_c8 * local_c8;
  auVar7._8_8_ = auVar1._8_8_ * auVar1._8_8_;
  auVar3 = vshufpd_avx(auVar1,auVar1,1);
  local_d8 = local_c8 * local_a8;
  local_110 = auVar7._0_8_ * auVar3._0_8_;
  dStack_108 = auVar7._8_8_ * auVar3._8_8_;
  __x = *(double *)pauVar2[1];
  local_100 = auVar7._0_8_ * __x;
  auVar3 = vshufpd_avx(auVar7,auVar7,1);
  local_f8 = vmovlpd_avx(auVar7);
  local_f0 = auVar3._0_8_ * __x;
  local_e0 = local_d8 * __x;
  local_e8 = vmovhpd_avx(auVar7);
  local_d0 = local_c8 * __x * __x;
  local_c8 = local_c8 * __x;
  local_c0 = vmovlpd_avx(auVar1);
  local_b8 = local_a8 * __x * __x;
  local_b0 = local_a8 * __x;
  local_a0 = pow(__x,3.0);
  local_90 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[2]
  ;
  local_98 = local_90 * local_90;
  local_88 = 0x3ff0000000000000;
  local_190.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = (double *)this->_A;
  dStack_140 = 0.0;
  dStack_138 = 0.0;
  local_180 = 0.0;
  dStack_178 = 0.0;
  dStack_170 = 0.0;
  dStack_168 = 0.0;
  dStack_160 = 0.0;
  dStack_158 = 0.0;
  dStack_150 = 0.0;
  dStack_148 = 0.0;
  local_1a0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 1;
  local_190.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 10;
  local_1a0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = &local_120;
  Eigen::internal::
  general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
  ::run(10,0x14,&local_190,&local_1a0,&local_180,1,1.0);
  pdVar6 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if ((fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 10)
  {
    if (pdVar6 != (double *)0x0) {
      free((void *)pdVar6[-1]);
    }
    pvVar4 = malloc(0x90);
    if (pvVar4 == (void *)0x0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = acos;
      __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar4 & 0xffffffffffffffc0) + 0x38) = pvVar4;
    pdVar6 = (double *)(((ulong)pvVar4 & 0xffffffffffffffc0) + 0x40);
    (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar6
    ;
    (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 10;
  }
  *pdVar6 = local_180;
  pdVar6[1] = dStack_178;
  pdVar6[2] = dStack_170;
  pdVar6[3] = dStack_168;
  pdVar6[4] = dStack_160;
  pdVar6[5] = dStack_158;
  pdVar6[6] = dStack_150;
  pdVar6[7] = dStack_148;
  pdVar6[8] = dStack_140;
  pdVar6[9] = dStack_138;
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 3 );
    assert( (unsigned int) fvec.size() == 10);

    //create the monomials vector
    Eigen::Matrix<double,20,1> monomials;
    monomials[0] = pow(x[0],3);
    monomials[1] = pow(x[1],3);
    monomials[2] = pow(x[0],2)*x[1];
    monomials[3] = x[0]*pow(x[1],2);
    monomials[4] = pow(x[0],2)*x[2];
    monomials[5] = pow(x[0],2);
    monomials[6] = pow(x[1],2)*x[2];
    monomials[7] = pow(x[1],2);
    monomials[8] = x[0]*x[1]*x[2];
    monomials[9] = x[0]*x[1];
    monomials[10] = x[0]*pow(x[2],2);
    monomials[11] = x[0]*x[2];
    monomials[12] = x[0];
    monomials[13] = x[1]*pow(x[2],2);
    monomials[14] = x[1]*x[2];
    monomials[15] = x[1];
    monomials[16] = pow(x[2],3);
    monomials[17] = pow(x[2],2);
    monomials[18] = x[2];
    monomials[19] = 1.0;

    fvec = _A*monomials;

    return 0;
  }